

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  stbi__uint32 sVar1;
  uint uVar2;
  uint uVar3;
  int sgn;
  uint k;
  int n_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  sVar1 = j->code_buffer;
  uVar3 = j->code_buffer << ((byte)n & 0x1f) | j->code_buffer >> (0x20 - (byte)n & 0x1f);
  if ((-1 < n) && (n < 0x11)) {
    j->code_buffer = uVar3 & (stbi__bmask[n] ^ 0xffffffff);
    uVar2 = stbi__bmask[n];
    j->code_bits = j->code_bits - n;
    return (uVar2 & uVar3) + (stbi__jbias[n] & ((int)sVar1 >> 0x1f ^ 0xffffffffU));
  }
  __assert_fail("n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/stb/stb_image.h"
                ,0x7b6,"int stbi__extend_receive(stbi__jpeg *, int)");
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);

   sgn = (stbi__int32)j->code_buffer >> 31; // sign bit is always in MSB
   k = stbi_lrot(j->code_buffer, n);
   STBI_ASSERT(n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask)));
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & ~sgn);
}